

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLower.cpp
# Opt level: O0

void GetArgumentRegisters
               (ExpressionContext *ctx,RegVmLoweredFunction *lowFunction,RegVmLoweredBlock *lowBlock
               ,SmallArray<unsigned_char,_32U> *result,VmValue *value)

{
  bool bVar1;
  uchar local_39;
  VmFunction *pVStack_38;
  uchar targetReg;
  VmFunction *function;
  VmValue *value_local;
  SmallArray<unsigned_char,_32U> *result_local;
  RegVmLoweredBlock *lowBlock_local;
  RegVmLoweredFunction *lowFunction_local;
  ExpressionContext *ctx_local;
  
  function = (VmFunction *)value;
  value_local = (VmValue *)result;
  result_local = (SmallArray<unsigned_char,_32U> *)lowBlock;
  lowBlock_local = (RegVmLoweredBlock *)lowFunction;
  lowFunction_local = (RegVmLoweredFunction *)ctx;
  bVar1 = isType<VmConstant>(value);
  if (bVar1) {
    LowerConstantIntoBlock
              ((ExpressionContext *)lowFunction_local,(RegVmLoweredFunction *)lowBlock_local,
               (RegVmLoweredBlock *)result_local,(SmallArray<unsigned_char,_32U> *)value_local,
               &function->super_VmValue);
  }
  else {
    pVStack_38 = getType<VmFunction>(&function->super_VmValue);
    if (pVStack_38 == (VmFunction *)0x0) {
      RegVmLoweredFunction::GetRegisters
                ((RegVmLoweredFunction *)lowBlock_local,
                 (SmallArray<unsigned_char,_32U> *)value_local,&function->super_VmValue);
    }
    else {
      local_39 = RegVmLoweredFunction::GetRegisterForConstant
                           ((RegVmLoweredFunction *)lowBlock_local);
      RegVmLoweredBlock::AddInstruction
                ((RegVmLoweredBlock *)result_local,(ExpressionContext *)lowFunction_local,
                 (pVStack_38->super_VmValue).source,rviFuncAddr,local_39,'\0','\0',
                 pVStack_38->function->functionIndex);
      SmallArray<unsigned_char,_32U>::push_back
                ((SmallArray<unsigned_char,_32U> *)value_local,&local_39);
    }
  }
  return;
}

Assistant:

void GetArgumentRegisters(ExpressionContext &ctx, RegVmLoweredFunction *lowFunction, RegVmLoweredBlock *lowBlock, SmallArray<unsigned char, 32> &result, VmValue *value)
{
	if(isType<VmConstant>(value))
	{
		LowerConstantIntoBlock(ctx, lowFunction, lowBlock, result, value);

		return;
	}

	if(VmFunction *function = getType<VmFunction>(value))
	{
		unsigned char targetReg = lowFunction->GetRegisterForConstant();

		lowBlock->AddInstruction(ctx, function->source, rviFuncAddr, targetReg, 0, 0, function->function->functionIndex);

		result.push_back(targetReg);

		return;
	}

	lowFunction->GetRegisters(result, value);
}